

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_3dmeasure.c
# Opt level: O1

HPDF_STATUS
HPDF_3DC3DMeasure_SetText(HPDF_3DMeasure measure,char *text,HPDF_Encoder_conflict encoder)

{
  HPDF_String obj;
  HPDF_STATUS HVar1;
  
  obj = HPDF_String_New(measure->mmgr,text,encoder);
  if (obj != (HPDF_String)0x0) {
    HVar1 = HPDF_Dict_Add(measure,"UT",obj);
    return HVar1;
  }
  HVar1 = HPDF_Error_GetCode(measure->error);
  return HVar1;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_3DC3DMeasure_SetText(HPDF_3DMeasure measure, 
						  const char* text,
						  HPDF_Encoder encoder)
{
	HPDF_STATUS ret = HPDF_OK;
	HPDF_String s;

	s = HPDF_String_New (measure->mmgr, text, encoder);
	if (!s)
		return HPDF_Error_GetCode ( measure->error);

	ret = HPDF_Dict_Add(measure, "UT", s);

	return ret;
}